

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O0

GLuint __thiscall
glcts::anon_unknown_0::ShaderImageLoadStoreBase::BuildShaderProgram
          (ShaderImageLoadStoreBase *this,GLenum type,char *src)

{
  GLchar local_448 [8];
  GLchar log [1024];
  int local_40;
  GLuint local_3c;
  GLint status;
  GLuint p;
  char *src3 [3];
  char *src_local;
  GLenum type_local;
  ShaderImageLoadStoreBase *this_local;
  
  _status = "#version 310 es";
  src3[0] = 
  "\nprecision highp float;\nprecision highp int;\nprecision highp sampler2D;\nprecision highp sampler3D;\nprecision highp samplerCube;\nprecision highp sampler2DArray;\nprecision highp isampler2D;\nprecision highp isampler3D;\nprecision highp isamplerCube;\nprecision highp isampler2DArray;\nprecision highp usampler2D;\nprecision highp usampler3D;\nprecision highp usamplerCube;\nprecision highp usampler2DArray;\nprecision highp image2D;\nprecision highp image3D;\nprecision highp imageCube;\nprecision highp image2DArray;\nprecision highp iimage2D;\nprecision highp iimage3D;\nprecision highp iimageCube;\nprecision highp iimage2DArray;\nprecision highp uimage2D;\nprecision highp uimage3D;\nprecision highp uimageCube;\nprecision highp uimage2DArray;"
  ;
  src3[1] = src;
  src3[2] = src;
  local_3c = glu::CallLogWrapper::glCreateShaderProgramv
                       (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,type,3,
                        (GLchar **)&status);
  glu::CallLogWrapper::glGetProgramiv
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,local_3c,0x8b82,
             &local_40);
  if (local_40 == 0) {
    glu::CallLogWrapper::glGetProgramInfoLog
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,local_3c,0x400,
               (GLsizei *)0x0,local_448);
    anon_unknown_0::Output("Program Info Log:\n%s\n%s\n%s\n%s\n",local_448,_status,src3[0],src3[1]);
  }
  return local_3c;
}

Assistant:

GLuint BuildShaderProgram(GLenum type, const char* src)
	{
		const char* const src3[3] = { kGLSLVer, kGLSLPrec, src };
		const GLuint	  p		  = glCreateShaderProgramv(type, 3, src3);
		GLint			  status;
		glGetProgramiv(p, GL_LINK_STATUS, &status);
		if (status == GL_FALSE)
		{
			GLchar log[1024];
			glGetProgramInfoLog(p, sizeof(log), NULL, log);
			Output("Program Info Log:\n%s\n%s\n%s\n%s\n", log, src3[0], src3[1], src3[2]);
		}
		return p;
	}